

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O2

void __thiscall Audiostream::Audiostream(Audiostream *this,string *filename)

{
  ALLEGRO_AUDIO_STREAM *pAVar1;
  
  (this->super_Element).x = 0;
  (this->super_Element).y = 0;
  (this->super_Element).w = 0x96;
  (this->super_Element).h = 0x28;
  (this->super_Element).attached_to = (Element *)0x0;
  (this->super_Element)._vptr_Element = (_func_int **)&PTR__Audiostream_0010cb48;
  (this->filename)._M_dataplus._M_p = (pointer)&(this->filename).field_2;
  (this->filename)._M_string_length = 0;
  (this->filename).field_2._M_local_buf[0] = '\0';
  Element::set_random_pos(&this->super_Element);
  basename((char *)filename);
  pAVar1 = (ALLEGRO_AUDIO_STREAM *)al_load_audio_stream((filename->_M_dataplus)._M_p,4,0x800);
  this->stream = pAVar1;
  if (pAVar1 != (ALLEGRO_AUDIO_STREAM *)0x0) {
    al_set_audio_stream_playmode(pAVar1,0x101);
  }
  return;
}

Assistant:

Audiostream::Audiostream(string const& filename)
{
   w = 150;
   set_random_pos();
   basename(filename, this->filename);

   stream = al_load_audio_stream(filename.c_str(), 4, 2048);
   if (stream) {
      al_set_audio_stream_playmode(stream, ALLEGRO_PLAYMODE_LOOP);
   }
}